

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O2

int Fra_ClauCheckProperty(Cla_Man_t *p,Vec_Int_t *vCex)

{
  sat_solver *s;
  int i;
  int iVar1;
  int iVar2;
  long lVar3;
  int i_00;
  
  s = p->pSatMain;
  for (lVar3 = 0; lVar3 < s->size; lVar3 = lVar3 + 1) {
    s->activity[lVar3] = 0;
  }
  s->var_inc = 1;
  iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
  vCex->nSize = 0;
  if (iVar1 == -1) {
    iVar1 = 1;
  }
  else {
    if (iVar1 != 1) {
      __assert_fail("RetValue == l_True",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                    ,0x162,"int Fra_ClauCheckProperty(Cla_Man_t *, Vec_Int_t *)");
    }
    iVar1 = 0;
    for (i_00 = 0; i_00 < p->vSatVarsMainCs->nSize; i_00 = i_00 + 1) {
      iVar2 = Vec_IntEntry(p->vSatVarsMainCs,i_00);
      iVar2 = sat_solver_var_literal(p->pSatMain,iVar2);
      Vec_IntPush(vCex,iVar2);
    }
  }
  return iVar1;
}

Assistant:

int Fra_ClauCheckProperty( Cla_Man_t * p, Vec_Int_t * vCex )
{
    int nBTLimit = 0;
    int RetValue, iVar, i;
    sat_solver_act_var_clear( p->pSatMain );
    RetValue = sat_solver_solve( p->pSatMain, NULL, NULL, (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    Vec_IntClear( vCex );
    if ( RetValue == l_False )
        return 1;
    assert( RetValue == l_True );
    Vec_IntForEachEntry( p->vSatVarsMainCs, iVar, i )
        Vec_IntPush( vCex, sat_solver_var_literal(p->pSatMain, iVar) );
/*
    {
        int i;
        for (i = 0; i < p->pSatMain->size; i++)
            printf( "%d=%d ", i, p->pSatMain->model.ptr[i] == l_True );
        printf( "\n" );
    }
*/
    return 0;
}